

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmem.c
# Opt level: O2

void * luaM_growaux_(lua_State *L,void *block,int nelems,int *psize,uint size_elems,int limit,
                    char *what)

{
  int iVar1;
  
  iVar1 = *psize;
  if (iVar1 <= nelems) {
    if (iVar1 < limit / 2) {
      limit = 4;
      if (4 < iVar1 * 2) {
        limit = iVar1 * 2;
      }
    }
    else if (limit <= iVar1) {
      luaG_runerror(L,"too many %s (limit is %d)",what,(ulong)(uint)limit);
    }
    block = luaM_saferealloc_(L,block,(long)iVar1 * (ulong)size_elems,
                              (ulong)size_elems * (long)limit);
    *psize = limit;
  }
  return block;
}

Assistant:

void *luaM_growaux_ (lua_State *L, void *block, int nelems, int *psize,
                     unsigned size_elems, int limit, const char *what) {
  void *newblock;
  int size = *psize;
  if (nelems + 1 <= size)  /* does one extra element still fit? */
    return block;  /* nothing to be done */
  if (size >= limit / 2) {  /* cannot double it? */
    if (l_unlikely(size >= limit))  /* cannot grow even a little? */
      luaG_runerror(L, "too many %s (limit is %d)", what, limit);
    size = limit;  /* still have at least one free place */
  }
  else {
    size *= 2;
    if (size < MINSIZEARRAY)
      size = MINSIZEARRAY;  /* minimum size */
  }
  lua_assert(nelems + 1 <= size && size <= limit);
  /* 'limit' ensures that multiplication will not overflow */
  newblock = luaM_saferealloc_(L, block, cast_sizet(*psize) * size_elems,
                                         cast_sizet(size) * size_elems);
  *psize = size;  /* update only when everything else is OK */
  return newblock;
}